

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_get_macro_defundef
              (Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
              Dwarf_Unsigned *line_number,Dwarf_Unsigned *index,Dwarf_Unsigned *offset,
              Dwarf_Half *forms_count,char **macro_string,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Unsigned myerrno;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Unsigned DStack_190;
  int lu_res_4;
  Dwarf_Unsigned lu_local_4;
  Dwarf_Unsigned lu_leblen_4;
  Dwarf_Error lerr;
  char *pcStack_170;
  int resup;
  char *localstring;
  Dwarf_Unsigned supoffset;
  Dwarf_Unsigned linenum_3;
  char *localstr_1;
  Dwarf_Unsigned DStack_148;
  int lu_res_3;
  Dwarf_Unsigned lu_local_3;
  Dwarf_Unsigned lu_leblen_3;
  Dwarf_Unsigned DStack_130;
  int lu_res_2;
  Dwarf_Unsigned lu_local_2;
  Dwarf_Unsigned lu_leblen_2;
  Dwarf_Small *pDStack_118;
  Dwarf_Small form1_1;
  Dwarf_Byte_Ptr mdata_copy;
  Dwarf_Unsigned DStack_108;
  int ress;
  Dwarf_Unsigned offsettostr;
  Dwarf_Unsigned stringindex;
  Dwarf_Unsigned linenum_2;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned DStack_d8;
  int lu_res_1;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen_1;
  char *localstr;
  Dwarf_Byte_Ptr pDStack_b8;
  Dwarf_Small form1;
  Dwarf_Unsigned stringoffset;
  Dwarf_Unsigned linenum_1;
  char *pcStack_a0;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  char *content;
  Dwarf_Unsigned linenum;
  Dwarf_Macro_Operator_s *pDStack_78;
  uint macop;
  Dwarf_Macro_Operator_s *curop;
  Dwarf_Small *pDStack_68;
  Dwarf_Half lformscount;
  Dwarf_Small *endptr;
  Dwarf_Small *startptr;
  Dwarf_Small *pDStack_50;
  int res;
  Dwarf_Small *mdata;
  Dwarf_Debug dbg;
  Dwarf_Half *forms_count_local;
  Dwarf_Unsigned *offset_local;
  Dwarf_Unsigned *index_local;
  Dwarf_Unsigned *line_number_local;
  Dwarf_Unsigned op_number_local;
  Dwarf_Macro_Context macro_context_local;
  
  mdata = (Dwarf_Small *)0x0;
  pDStack_50 = (Dwarf_Small *)0x0;
  startptr._4_4_ = 0;
  endptr = (Dwarf_Small *)0x0;
  pDStack_68 = (Dwarf_Small *)0x0;
  curop._6_2_ = 0;
  pDStack_78 = (Dwarf_Macro_Operator_s *)0x0;
  linenum._4_4_ = 0;
  dbg = (Dwarf_Debug)forms_count;
  forms_count_local = (Dwarf_Half *)offset;
  offset_local = index;
  index_local = line_number;
  line_number_local = (Dwarf_Unsigned *)op_number;
  op_number_local = (Dwarf_Unsigned)macro_context;
  if ((macro_context == (Dwarf_Macro_Context)0x0) || (macro_context->mc_sentinel != 0xada)) {
    if (macro_context != (Dwarf_Macro_Context)0x0) {
      mdata = (Dwarf_Small *)macro_context->mc_dbg;
    }
    _dwarf_error_string((Dwarf_Debug)mdata,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    macro_context_local._4_4_ = 1;
  }
  else {
    mdata = (Dwarf_Small *)macro_context->mc_dbg;
    if (op_number < macro_context->mc_macro_ops_count) {
      pDStack_78 = macro_context->mc_ops + op_number;
      linenum._4_4_ = (uint)pDStack_78->mo_opcode;
      endptr = macro_context->mc_macro_header;
      pDStack_68 = endptr + macro_context->mc_total_length;
      pDStack_50 = pDStack_78->mo_data;
      curop._6_2_ = (ushort)pDStack_78->mo_form->mf_formcount;
      if (curop._6_2_ == 2) {
        switch(linenum._4_4_) {
        case 1:
        case 2:
          content = (char *)0x0;
          lu_leblen = 0;
          lu_local = 0;
          pcStack_a0 = (char *)0x0;
          linenum_1._4_4_ = 0;
          linenum_1._4_4_ =
               dwarf_decode_leb128((char *)pDStack_50,&lu_local,
                                   (Dwarf_Unsigned *)&stack0xffffffffffffff60,(char *)pDStack_68);
          if (linenum_1._4_4_ == 1) {
            _dwarf_error_string((Dwarf_Debug)mdata,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            macro_context_local._4_4_ = 1;
          }
          else {
            content = pcStack_a0;
            lu_leblen = (Dwarf_Unsigned)(pDStack_50 + lu_local);
            pDStack_50 = (Dwarf_Small *)lu_leblen;
            macro_context_local._4_4_ =
                 _dwarf_check_string_valid
                           ((Dwarf_Debug)mdata,endptr,(void *)lu_leblen,pDStack_68,0x16e,error);
            if (macro_context_local._4_4_ == 0) {
              *index_local = (Dwarf_Unsigned)content;
              *offset_local = 0;
              forms_count_local[0] = 0;
              forms_count_local[1] = 0;
              forms_count_local[2] = 0;
              forms_count_local[3] = 0;
              *(ushort *)&dbg->de_magic = curop._6_2_;
              *macro_string = (char *)lu_leblen;
              macro_context_local._4_4_ = 0;
            }
          }
          break;
        default:
          _dwarf_error((Dwarf_Debug)mdata,error,0x144);
          macro_context_local._4_4_ = 1;
          break;
        case 5:
        case 6:
          stringoffset = 0;
          pDStack_b8 = (Dwarf_Byte_Ptr)0x0;
          localstr._7_1_ = pDStack_78->mo_form->mf_formbytes[1];
          lu_leblen_1 = 0;
          lu_local_1 = 0;
          DStack_d8 = 0;
          _ltmp._4_4_ = 0;
          _ltmp._4_4_ = dwarf_decode_leb128((char *)pDStack_50,&lu_local_1,&stack0xffffffffffffff28,
                                            (char *)pDStack_68);
          if (_ltmp._4_4_ == 1) {
            _dwarf_error_string((Dwarf_Debug)mdata,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            macro_context_local._4_4_ = 1;
          }
          else {
            stringoffset = DStack_d8;
            pDStack_50 = pDStack_50 + lu_local_1;
            readend = (Dwarf_Byte_Ptr)0x0;
            linenum_2 = (Dwarf_Unsigned)(pDStack_50 + (int)(uint)*(byte *)(op_number_local + 0x40));
            if (linenum_2 < pDStack_50) {
              _dwarf_error_string((Dwarf_Debug)mdata,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                                 );
              macro_context_local._4_4_ = 1;
            }
            else if (pDStack_68 < linenum_2) {
              _dwarf_error_string((Dwarf_Debug)mdata,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                 );
              macro_context_local._4_4_ = 1;
            }
            else {
              (**(code **)(mdata + 0x1bf8))
                        (&readend,pDStack_50,*(undefined1 *)(op_number_local + 0x40));
              pDStack_b8 = readend;
              iVar1 = _dwarf_extract_local_debug_str_string_given_offset
                                ((Dwarf_Debug)mdata,(uint)localstr._7_1_,(Dwarf_Unsigned)readend,
                                 (char **)&lu_leblen_1,error);
              *offset_local = 0;
              *index_local = stringoffset;
              *(Dwarf_Byte_Ptr *)forms_count_local = pDStack_b8;
              *(ushort *)&dbg->de_magic = curop._6_2_;
              if (iVar1 == 1) {
                *macro_string = "<Error: getting local .debug_str>";
                macro_context_local._4_4_ = 1;
              }
              else {
                if (iVar1 == -1) {
                  *macro_string = "<Error: NO_ENTRY on .debug_string (strp)>";
                }
                else {
                  *macro_string = (char *)lu_leblen_1;
                }
                macro_context_local._4_4_ = 0;
              }
            }
          }
          break;
        case 8:
        case 9:
          supoffset = 0;
          localstring = (char *)0x0;
          pcStack_170 = (char *)0x0;
          lerr._4_4_ = 0;
          lu_leblen_4 = 0;
          lu_local_4 = 0;
          DStack_190 = 0;
          _ltmp_1._4_4_ = 0;
          _ltmp_1._4_4_ =
               dwarf_decode_leb128((char *)pDStack_50,&lu_local_4,&stack0xfffffffffffffe70,
                                   (char *)pDStack_68);
          if (_ltmp_1._4_4_ == 1) {
            _dwarf_error_string((Dwarf_Debug)mdata,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            macro_context_local._4_4_ = 1;
          }
          else {
            supoffset = DStack_190;
            pDStack_50 = pDStack_50 + lu_local_4;
            readend_1 = (Dwarf_Byte_Ptr)0x0;
            if (pDStack_50 + (int)(uint)*(byte *)(op_number_local + 0x40) < pDStack_50) {
              _dwarf_error_string((Dwarf_Debug)mdata,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                                 );
              macro_context_local._4_4_ = 1;
            }
            else if (pDStack_68 < pDStack_50 + (int)(uint)*(byte *)(op_number_local + 0x40)) {
              _dwarf_error_string((Dwarf_Debug)mdata,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                 );
              macro_context_local._4_4_ = 1;
            }
            else {
              (**(code **)(mdata + 0x1bf8))
                        (&readend_1,pDStack_50,*(undefined1 *)(op_number_local + 0x40));
              localstring = (char *)readend_1;
              *index_local = supoffset;
              *offset_local = 0;
              *(Dwarf_Byte_Ptr *)forms_count_local = readend_1;
              *(ushort *)&dbg->de_magic = curop._6_2_;
              lerr._4_4_ = _dwarf_get_string_from_tied
                                     ((Dwarf_Debug)mdata,(Dwarf_Unsigned)readend_1,
                                      &stack0xfffffffffffffe90,(Dwarf_Error *)&lu_leblen_4);
              if (lerr._4_4_ == 0) {
                *macro_string = pcStack_170;
                macro_context_local._4_4_ = lerr._4_4_;
              }
              else {
                if (lerr._4_4_ == 1) {
                  DVar2 = dwarf_errno((Dwarf_Error)lu_leblen_4);
                  if ((DVar2 & 0xffffffff) == 0x134) {
                    *macro_string = "<DW_FORM_str_sup-no-tied_file>";
                  }
                  else {
                    _dwarf_error((Dwarf_Debug)mdata,error,DVar2 & 0xffffffff);
                    *macro_string = "<Error: DW_FORM_str_sup-got-error>";
                  }
                  dwarf_dealloc((Dwarf_Debug)mdata,(Dwarf_Ptr)lu_leblen_4,0xe);
                }
                else {
                  *macro_string = "<DW_FORM_str_sup-no-entry>";
                }
                macro_context_local._4_4_ = lerr._4_4_;
              }
            }
          }
          break;
        case 0xb:
        case 0xc:
          stringindex = 0;
          offsettostr = 0;
          DStack_108 = 0;
          mdata_copy._4_4_ = 0;
          pDStack_118 = (Dwarf_Small *)0x0;
          lu_leblen_2._7_1_ = pDStack_78->mo_form->mf_formbytes[1];
          lu_local_2 = 0;
          DStack_130 = 0;
          lu_leblen_3._4_4_ = 0;
          lu_leblen_3._4_4_ =
               dwarf_decode_leb128((char *)pDStack_50,&lu_local_2,&stack0xfffffffffffffed0,
                                   (char *)pDStack_68);
          if (lu_leblen_3._4_4_ == 1) {
            _dwarf_error_string((Dwarf_Debug)mdata,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            macro_context_local._4_4_ = 1;
          }
          else {
            stringindex = DStack_130;
            pDStack_118 = pDStack_50 + lu_local_2;
            *index_local = DStack_130;
            lu_local_3 = 0;
            DStack_148 = 0;
            localstr_1._4_4_ = 0;
            pDStack_50 = pDStack_118;
            localstr_1._4_4_ =
                 dwarf_decode_leb128((char *)pDStack_118,&lu_local_3,&stack0xfffffffffffffeb8,
                                     (char *)pDStack_68);
            if (localstr_1._4_4_ == 1) {
              _dwarf_error_string((Dwarf_Debug)mdata,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
              macro_context_local._4_4_ = 1;
            }
            else {
              offsettostr = DStack_148;
              pDStack_118 = pDStack_118 + lu_local_3;
              *offset_local = DStack_148;
              *(ushort *)&dbg->de_magic = curop._6_2_;
              mdata_copy._4_4_ =
                   _dwarf_extract_string_offset_via_str_offsets
                             ((Dwarf_Debug)mdata,pDStack_118,pDStack_68,(ushort)lu_leblen_2._7_1_,
                              *(Dwarf_CU_Context_conflict *)(op_number_local + 0xb0),
                              &stack0xfffffffffffffef8,error);
              if (mdata_copy._4_4_ == 1) {
                macro_context_local._4_4_ = 1;
              }
              else {
                if (mdata_copy._4_4_ == 0) {
                  linenum_3 = 0;
                  *offset_local = offsettostr;
                  *(Dwarf_Unsigned *)forms_count_local = DStack_108;
                  iVar1 = _dwarf_extract_local_debug_str_string_given_offset
                                    ((Dwarf_Debug)mdata,(uint)lu_leblen_2._7_1_,DStack_108,
                                     (char **)&linenum_3,error);
                  if (iVar1 == 1) {
                    return 1;
                  }
                  if (iVar1 == -1) {
                    *macro_string = "<:No string available>";
                  }
                  else {
                    *macro_string = (char *)linenum_3;
                  }
                }
                else {
                  *offset_local = offsettostr;
                  forms_count_local[0] = 0;
                  forms_count_local[1] = 0;
                  forms_count_local[2] = 0;
                  forms_count_local[3] = 0;
                  *macro_string = "<.debug_str_offsets not available>";
                }
                macro_context_local._4_4_ = 0;
              }
            }
          }
        }
      }
      else {
        macro_context_local._4_4_ = -1;
      }
    }
    else {
      _dwarf_error((Dwarf_Debug)mdata,error,0x143);
      macro_context_local._4_4_ = 1;
    }
  }
  return macro_context_local._4_4_;
}

Assistant:

int
dwarf_get_macro_defundef(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned op_number,
    Dwarf_Unsigned * line_number,
    Dwarf_Unsigned * index,
    Dwarf_Unsigned * offset,
    Dwarf_Half     * forms_count,
    const char     ** macro_string,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Small *mdata = 0;
    int res = 0;
    Dwarf_Small *startptr = 0;
    Dwarf_Small *endptr = 0;
    Dwarf_Half lformscount = 0;
    struct Dwarf_Macro_Operator_s *curop = 0;
    unsigned macop = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    macop = curop->mo_opcode;
    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    mdata = curop->mo_data;
    lformscount = curop->mo_form->mf_formcount;
    if (lformscount != 2) {
        /*_dwarf_error(dbg, error,DW_DLE_MACRO_OPCODE_FORM_BAD);*/
        return DW_DLV_NO_ENTRY;
    }
    switch(macop){
    case DW_MACRO_define:
    case DW_MACRO_undef: {
        Dwarf_Unsigned linenum = 0;
        const char * content = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        content = (const char *)mdata;
        res = _dwarf_check_string_valid(dbg,
            startptr,mdata, endptr,
            DW_DLE_MACRO_STRING_BAD,error);
        if (res != DW_DLV_OK) {
            return res;
        }
        *line_number = linenum;
        *index = 0;
        *offset = 0;
        *forms_count = lformscount;
        *macro_string = content;
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strp:
    case DW_MACRO_undef_strp: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringoffset = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];
        char * localstr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,stringoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        res = _dwarf_extract_local_debug_str_string_given_offset(dbg,
            form1,
            stringoffset,
            &localstr,
            error);
        *index = 0;
        *line_number = linenum;
        *offset = stringoffset;
        *forms_count = lformscount;
        if (res == DW_DLV_ERROR) {
            *macro_string = "<Error: getting local .debug_str>";
            return res;
        } else if (res == DW_DLV_NO_ENTRY) {
            *macro_string = "<Error: NO_ENTRY on "
                ".debug_string (strp)>";
        } else {
            *macro_string = (const char *)localstr;
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_strx:
    case DW_MACRO_undef_strx: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned stringindex = 0;
        Dwarf_Unsigned offsettostr= 0;
        int ress = 0;
        Dwarf_Byte_Ptr mdata_copy = 0;
        Dwarf_Small form1 =  curop->mo_form->mf_formbytes[1];

        DECODE_LEB128_UWORD_CK(mdata,linenum, dbg, error,endptr);
        *line_number = linenum;
        mdata_copy = mdata;
        DECODE_LEB128_UWORD_CK(mdata_copy,stringindex,
            dbg, error,endptr);
        /* mdata_copy is for call below */

        *index = stringindex;
        *forms_count = lformscount;

        /* Redoes the index-getting. Gets offset. */
        ress = _dwarf_extract_string_offset_via_str_offsets(dbg,
            mdata_copy,
            endptr,
            form1,
            macro_context->mc_cu_context,
            &offsettostr,
            error);
        if (ress  == DW_DLV_ERROR) {
            return ress;
        }
        if (ress == DW_DLV_OK) {
            char *localstr = 0;

            *index = stringindex;
            *offset = offsettostr;
            ress =
                _dwarf_extract_local_debug_str_string_given_offset(
                dbg,
                form1,
                offsettostr,
                &localstr,
                error);
            if (ress == DW_DLV_ERROR) {
                return ress;
            } else if (ress == DW_DLV_NO_ENTRY){
                *macro_string = "<:No string available>";
            } else {
                *macro_string = (const char *)localstr;
                /* All is ok. */
            }
        } else {
            *index = stringindex;
            *offset = 0;
            *macro_string = "<.debug_str_offsets not available>";
        }
        }
        return DW_DLV_OK;
    case DW_MACRO_define_sup:
    case DW_MACRO_undef_sup: {
        Dwarf_Unsigned linenum = 0;
        Dwarf_Unsigned supoffset = 0;
        char *localstring = 0;
        int resup = 0;
        Dwarf_Error lerr = 0;

        DECODE_LEB128_UWORD_CK(mdata,linenum,
            dbg, error,endptr);
        READ_UNALIGNED_CK(dbg,supoffset,Dwarf_Unsigned,
            mdata,macro_context->mc_offset_size,
            error,endptr);
        *line_number = linenum;
        *index = 0;
        *offset = supoffset;
        *forms_count = lformscount;
        resup = _dwarf_get_string_from_tied(dbg, supoffset,
            &localstring, &lerr);
        if (resup != DW_DLV_OK) {
            if (resup == DW_DLV_ERROR) {
                Dwarf_Unsigned myerrno =
                    (unsigned int)dwarf_errno(lerr);
                if (myerrno == DW_DLE_NO_TIED_FILE_AVAILABLE) {
                    *macro_string =
                        (char *)"<DW_FORM_str_sup-no-tied_file>";
                } else {
                    _dwarf_error(dbg,error,myerrno);
                    *macro_string =
                        (char *)"<Error: DW_FORM_str_sup-got-error>";
                }
                dwarf_dealloc(dbg,lerr,DW_DLA_ERROR);
            } else {
                *macro_string = "<DW_FORM_str_sup-no-entry>";
            }
            return resup;
        }
        *macro_string = (const char *)localstring;
        /*  If NO ENTRY available, return DW_DLV_NO_ENTRY.
            We suspect this is better than DW_DLV_OK.  */
        return resup;
        }
    default:
        _dwarf_error(dbg,error,DW_DLE_MACRO_OP_UNHANDLED);
        return DW_DLV_ERROR;
    }
    return DW_DLV_NO_ENTRY;
}